

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O3

type unodb::qsbr_state::inc_thread_count(type word)

{
  bool bVar1;
  uint uVar2;
  type tVar3;
  uint uVar4;
  uint uVar5;
  qsbr_epoch local_21;
  
  uVar4 = (uint)((word & 0x3fffffff3fffffff) >> 0x20);
  uVar2 = (uint)(word & 0x3fffffff3fffffff);
  if (uVar2 <= uVar4) {
    tVar3 = word + 0x100000000;
    uVar5 = (uint)(tVar3 >> 0x20) & 0x3fffffff;
    if (uVar2 <= uVar5) {
      bVar1 = detail::qsbr_epoch::operator==(&local_21,(qsbr_epoch)(epoch_type)(tVar3 >> 0x3e));
      if (!bVar1) {
        __assert_fail("get_epoch(word) == get_epoch(result)",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                      ,0x117,"static type unodb::qsbr_state::inc_thread_count(type)");
      }
      if (uVar4 + 1 == uVar5) {
        return tVar3;
      }
      __assert_fail("get_thread_count(word) + 1 == get_thread_count(result)",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                    ,0x11a,"static type unodb::qsbr_state::inc_thread_count(type)");
    }
  }
  __assert_fail("threads_in_previous <= thread_count",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                ,0x19b,"static void unodb::qsbr_state::assert_invariants(type)");
}

Assistant:

[[nodiscard, gnu::const]] static constexpr type inc_thread_count(
      type word) noexcept {
    assert_invariants(word);

    const auto result = word + one_thread_in_count;

    assert_invariants(result);
    UNODB_DETAIL_ASSERT(get_epoch(word) == get_epoch(result));
    UNODB_DETAIL_ASSERT(get_threads_in_previous_epoch(word) ==
                        get_threads_in_previous_epoch(result));
    UNODB_DETAIL_ASSERT(get_thread_count(word) + 1 == get_thread_count(result));

    return result;
  }